

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3ExprAnd(sqlite3 *db,Expr *pLeft,Expr *pRight)

{
  int iVar1;
  Expr *pEVar2;
  
  pEVar2 = pRight;
  if ((pLeft != (Expr *)0x0) && (pEVar2 = pLeft, pRight != (Expr *)0x0)) {
    iVar1 = exprAlwaysFalse(pLeft);
    if ((iVar1 != 0) || (iVar1 = exprAlwaysFalse(pRight), iVar1 != 0)) {
      sqlite3ExprDeleteNN(db,pLeft);
      sqlite3ExprDeleteNN(db,pRight);
      pEVar2 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens,0);
      return pEVar2;
    }
    pEVar2 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
    if (pEVar2 != (Expr *)0x0) {
      pEVar2->op = '\0';
      pEVar2->affinity = '\0';
      *(undefined2 *)&pEVar2->field_0x2 = 0;
      pEVar2->flags = 0;
      (pEVar2->u).zToken = (char *)0x0;
      pEVar2->iColumn = 0;
      pEVar2->iAgg = 0;
      pEVar2->iRightJoinTable = 0;
      pEVar2->op2 = '\0';
      pEVar2->field_0x37 = 0;
      pEVar2->pAggInfo = (AggInfo *)0x0;
      (pEVar2->x).pList = (ExprList *)0x0;
      pEVar2->nHeight = 0;
      pEVar2->iTable = 0;
      pEVar2->pLeft = (Expr *)0x0;
      pEVar2->pRight = (Expr *)0x0;
      (pEVar2->y).pTab = (Table *)0x0;
      pEVar2->op = ',';
      pEVar2->iAgg = -1;
      pEVar2->nHeight = 1;
    }
    sqlite3ExprAttachSubtrees(db,pEVar2,pLeft,pRight);
  }
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(sqlite3 *db, Expr *pLeft, Expr *pRight){
  if( pLeft==0 ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else if( exprAlwaysFalse(pLeft) || exprAlwaysFalse(pRight) ){
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
    return sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0);
  }else{
    Expr *pNew = sqlite3ExprAlloc(db, TK_AND, 0, 0);
    sqlite3ExprAttachSubtrees(db, pNew, pLeft, pRight);
    return pNew;
  }
}